

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# event.c
# Opt level: O1

void event_base_free_(event_base *base,int run_finalizers)

{
  short *psVar1;
  common_timeout_list *__ptr;
  common_timeout_list **__ptr_00;
  event_callback *peVar2;
  event_callback *peVar3;
  event_once *peVar4;
  event_once *__ptr_01;
  _func_void_event_base_ptr *p_Var5;
  event **__ptr_02;
  event *ev;
  int iVar6;
  event_base *base_00;
  event *peVar7;
  uint uVar8;
  long lVar9;
  uint uVar10;
  
  base_00 = event_global_current_base_;
  if (event_global_current_base_ == (event_base *)0x0) {
    base_00 = base;
  }
  if (base != (event_base *)0x0) {
    base_00 = base;
  }
  if (base_00 == (event_base *)0x0) {
    event_warnx("%s: no base to free","event_base_free_");
    return;
  }
  if (base_00->th_notify_fd[0] != -1) {
    peVar7 = &base_00->th_notify;
    event_del_(peVar7,2);
    evutil_closesocket(base_00->th_notify_fd[0]);
    if (base_00->th_notify_fd[1] != -1) {
      evutil_closesocket(base_00->th_notify_fd[1]);
    }
    base_00->th_notify_fd[0] = -1;
    base_00->th_notify_fd[1] = -1;
    event_debug_assert_not_added_(peVar7);
    event_debug_note_teardown_(peVar7);
    psVar1 = &(base_00->th_notify).ev_evcallback.evcb_flags;
    *(byte *)psVar1 = (byte)*psVar1 & 0x7f;
  }
  evmap_delete_all_(base_00);
  uVar10 = 0;
  while( true ) {
    if ((base_00->timeheap).n == 0) {
      peVar7 = (event *)0x0;
    }
    else {
      peVar7 = *(base_00->timeheap).p;
    }
    if (peVar7 == (event *)0x0) break;
    event_del_(peVar7,2);
    uVar10 = uVar10 + 1;
  }
  if (0 < base_00->n_common_timeouts) {
    lVar9 = 0;
    do {
      __ptr = base_00->common_timeout_queues[lVar9];
      peVar7 = &__ptr->timeout_event;
      event_del_(peVar7,2);
      event_debug_assert_not_added_(peVar7);
      event_debug_note_teardown_(peVar7);
      psVar1 = &(__ptr->timeout_event).ev_evcallback.evcb_flags;
      *(byte *)psVar1 = (byte)*psVar1 & 0x7f;
      peVar7 = (__ptr->events).tqh_first;
      while (ev = peVar7, ev != (event *)0x0) {
        peVar7 = (ev->ev_timeout_pos).ev_next_with_common_timeout.tqe_next;
        if (((ev->ev_evcallback).evcb_flags & 0x10) == 0) {
          event_del_(ev,2);
          uVar10 = uVar10 + 1;
        }
      }
      if (mm_free_fn_ == (_func_void_void_ptr *)0x0) {
        free(__ptr);
      }
      else {
        (*mm_free_fn_)(__ptr);
      }
      lVar9 = lVar9 + 1;
    } while (lVar9 < base_00->n_common_timeouts);
  }
  __ptr_00 = base_00->common_timeout_queues;
  if (__ptr_00 != (common_timeout_list **)0x0) {
    if (mm_free_fn_ == (_func_void_void_ptr *)0x0) {
      free(__ptr_00);
    }
    else {
      (*mm_free_fn_)(__ptr_00);
    }
  }
  do {
    uVar8 = 0;
    if (0 < base_00->nactivequeues) {
      lVar9 = 0;
      uVar8 = 0;
      do {
        peVar3 = base_00->activequeues[lVar9].tqh_first;
        while (peVar3 != (event_callback *)0x0) {
          peVar2 = (peVar3->evcb_active_next).tqe_next;
          iVar6 = event_base_cancel_single_callback_(base_00,peVar3,run_finalizers);
          uVar8 = uVar8 + iVar6;
          peVar3 = peVar2;
        }
        lVar9 = lVar9 + 1;
      } while (lVar9 < base_00->nactivequeues);
    }
    while (peVar3 = (base_00->active_later_queue).tqh_first, peVar3 != (event_callback *)0x0) {
      iVar6 = event_base_cancel_single_callback_(base_00,peVar3,run_finalizers);
      uVar8 = uVar8 + iVar6;
    }
    if (event_debug_logging_mask_ != 0) {
      event_debugx_("%s: %d events freed","event_base_free_",(ulong)uVar8);
    }
    uVar10 = uVar10 + uVar8;
  } while (uVar8 != 0);
  if ((uVar10 != 0) && (event_debug_logging_mask_ != 0)) {
    event_debugx_("%s: %d events were still set in base","event_base_free_",(ulong)uVar10);
  }
  while (__ptr_01 = (base_00->once_events).lh_first, __ptr_01 != (event_once *)0x0) {
    peVar4 = (__ptr_01->next_once).le_next;
    if (peVar4 != (event_once *)0x0) {
      (peVar4->next_once).le_prev = (__ptr_01->next_once).le_prev;
    }
    *(__ptr_01->next_once).le_prev = (__ptr_01->next_once).le_next;
    if (mm_free_fn_ == (_func_void_void_ptr *)0x0) {
      free(__ptr_01);
    }
    else {
      (*mm_free_fn_)(__ptr_01);
    }
  }
  if ((base_00->evsel != (eventop *)0x0) &&
     (p_Var5 = base_00->evsel->dealloc, p_Var5 != (_func_void_event_base_ptr *)0x0)) {
    (*p_Var5)(base_00);
  }
  if (0 < (long)base_00->nactivequeues) {
    lVar9 = 0;
    do {
      if (*(long *)((long)&base_00->activequeues->tqh_first + lVar9) != 0) {
        event_base_free__cold_1();
        goto LAB_001ec9df;
      }
      lVar9 = lVar9 + 0x10;
    } while ((long)base_00->nactivequeues * 0x10 != lVar9);
  }
  if ((base_00->timeheap).n == 0) {
    __ptr_02 = (base_00->timeheap).p;
    if (__ptr_02 != (event **)0x0) {
      if (mm_free_fn_ == (_func_void_void_ptr *)0x0) {
        free(__ptr_02);
      }
      else {
        (*mm_free_fn_)(__ptr_02);
      }
    }
    if (mm_free_fn_ == (_func_void_void_ptr *)0x0) {
      free(base_00->activequeues);
    }
    else {
      (*mm_free_fn_)(base_00->activequeues);
    }
    evmap_io_clear_(&base_00->io);
    evmap_signal_clear_(&base_00->sigmap);
    event_changelist_freemem_(&base_00->changelist);
    if (evthread_lock_fns_.free != (_func_void_void_ptr_uint *)0x0 &&
        base_00->th_base_lock != (void *)0x0) {
      (*evthread_lock_fns_.free)(base_00->th_base_lock,0);
    }
    if (base_00->current_event_cond != (void *)0x0) {
      (*evthread_cond_fns_.free_condition)(base_00->current_event_cond);
    }
    if (base_00 == event_global_current_base_) {
      event_global_current_base_ = (event_base *)0x0;
    }
    if (mm_free_fn_ != (_func_void_void_ptr *)0x0) {
      (*mm_free_fn_)(base_00);
      return;
    }
    free(base_00);
    return;
  }
LAB_001ec9df:
  event_base_free__cold_2();
}

Assistant:

static void
event_base_free_(struct event_base *base, int run_finalizers)
{
	int i, n_deleted=0;
	struct event *ev;
	/* XXXX grab the lock? If there is contention when one thread frees
	 * the base, then the contending thread will be very sad soon. */

	/* event_base_free(NULL) is how to free the current_base if we
	 * made it with event_init and forgot to hold a reference to it. */
	if (base == NULL && current_base)
		base = current_base;
	/* Don't actually free NULL. */
	if (base == NULL) {
		event_warnx("%s: no base to free", __func__);
		return;
	}
	/* XXX(niels) - check for internal events first */

#ifdef _WIN32
	event_base_stop_iocp_(base);
#endif

	/* threading fds if we have them */
	if (base->th_notify_fd[0] != -1) {
		event_del(&base->th_notify);
		EVUTIL_CLOSESOCKET(base->th_notify_fd[0]);
		if (base->th_notify_fd[1] != -1)
			EVUTIL_CLOSESOCKET(base->th_notify_fd[1]);
		base->th_notify_fd[0] = -1;
		base->th_notify_fd[1] = -1;
		event_debug_unassign(&base->th_notify);
	}

	/* Delete all non-internal events. */
	evmap_delete_all_(base);

	while ((ev = min_heap_top_(&base->timeheap)) != NULL) {
		event_del(ev);
		++n_deleted;
	}
	for (i = 0; i < base->n_common_timeouts; ++i) {
		struct common_timeout_list *ctl =
		    base->common_timeout_queues[i];
		event_del(&ctl->timeout_event); /* Internal; doesn't count */
		event_debug_unassign(&ctl->timeout_event);
		for (ev = TAILQ_FIRST(&ctl->events); ev; ) {
			struct event *next = TAILQ_NEXT(ev,
			    ev_timeout_pos.ev_next_with_common_timeout);
			if (!(ev->ev_flags & EVLIST_INTERNAL)) {
				event_del(ev);
				++n_deleted;
			}
			ev = next;
		}
		mm_free(ctl);
	}
	if (base->common_timeout_queues)
		mm_free(base->common_timeout_queues);

	for (;;) {
		/* For finalizers we can register yet another finalizer out from
		 * finalizer, and iff finalizer will be in active_later_queue we can
		 * add finalizer to activequeues, and we will have events in
		 * activequeues after this function returns, which is not what we want
		 * (we even have an assertion for this).
		 *
		 * A simple case is bufferevent with underlying (i.e. filters).
		 */
		int i = event_base_free_queues_(base, run_finalizers);
		event_debug(("%s: %d events freed", __func__, i));
		if (!i) {
			break;
		}
		n_deleted += i;
	}

	if (n_deleted)
		event_debug(("%s: %d events were still set in base",
			__func__, n_deleted));

	while (LIST_FIRST(&base->once_events)) {
		struct event_once *eonce = LIST_FIRST(&base->once_events);
		LIST_REMOVE(eonce, next_once);
		mm_free(eonce);
	}

	if (base->evsel != NULL && base->evsel->dealloc != NULL)
		base->evsel->dealloc(base);

	for (i = 0; i < base->nactivequeues; ++i)
		EVUTIL_ASSERT(TAILQ_EMPTY(&base->activequeues[i]));

	EVUTIL_ASSERT(min_heap_empty_(&base->timeheap));
	min_heap_dtor_(&base->timeheap);

	mm_free(base->activequeues);

	evmap_io_clear_(&base->io);
	evmap_signal_clear_(&base->sigmap);
	event_changelist_freemem_(&base->changelist);

	EVTHREAD_FREE_LOCK(base->th_base_lock, 0);
	EVTHREAD_FREE_COND(base->current_event_cond);

	/* If we're freeing current_base, there won't be a current_base. */
	if (base == current_base)
		current_base = NULL;
	mm_free(base);
}